

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O2

void __thiscall duckdb::ColumnReader::~ColumnReader(ColumnReader *this)

{
  long lVar1;
  
  this->_vptr_ColumnReader = (_func_int **)&PTR__ColumnReader_027d7b40;
  lVar1 = 0;
  do {
    AllocatedData::~AllocatedData
              ((AllocatedData *)
               ((long)&this->encoding_buffers[1].allocated_data.allocator.ptr + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x60);
  ::std::unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>_>::~unique_ptr
            (&(this->byte_stream_split_decoder).bss_decoder.
              super_unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>_>);
  ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
            (&(this->delta_byte_array_decoder).byte_array_data.
              super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>);
  ::std::unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>::~unique_ptr
            (&(this->rle_decoder).rle_decoder.
              super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>);
  ::std::unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_>::~unique_ptr
            (&(this->delta_binary_packed_decoder).dbp_decoder.
              super_unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_>);
  DictionaryDecoder::~DictionaryDecoder(&this->dictionary_decoder);
  ::std::unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>::~unique_ptr
            (&(this->repeated_decoder).
              super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>);
  ::std::unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>::~unique_ptr
            (&(this->defined_decoder).
              super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->block).internal.
              super___shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

ColumnReader::~ColumnReader() {
}